

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis)

{
  int iVar1;
  Vec_Int_t *p;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Vec_t *vFramePPs;
  void **ppvVar6;
  void *pvVar7;
  Vec_Int_t *vRoots;
  int *piVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int local_48;
  
  pVVar5 = pAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      if (pVVar5->pArray[lVar10] != (void *)0x0) {
        *(undefined4 *)((long)pVVar5->pArray[lVar10] + 0x28) = 0xffffffff;
        pVVar5 = pAig->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  uVar13 = pCex->iFrame;
  uVar3 = uVar13 + 1;
  vFramePPs = (Vec_Vec_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar13) {
    uVar9 = uVar3;
  }
  vFramePPs->nCap = uVar9;
  if (uVar9 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar9 << 3);
  }
  vFramePPs->pArray = ppvVar6;
  if (-1 < (int)uVar13) {
    uVar12 = 0;
    do {
      pvVar7 = calloc(1,0x10);
      ppvVar6[uVar12] = pvVar7;
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
  }
  vFramePPs->nSize = uVar3;
  iVar1 = pCex->nRegs;
  iVar14 = uVar3 * pCex->nPis + iVar1;
  if (iVar14 < 0) {
LAB_00505de8:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  (pAig->pConst1->field_5).iData = iVar14 * 2 + 1;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  piVar8 = (int *)malloc(4000);
  vRoots->pArray = piVar8;
  if (-1 < pCex->iFrame) {
    uVar3 = 0xffffffff;
    if (-1 < (int)uVar13) {
      uVar3 = uVar13;
    }
    uVar12 = 0;
    do {
      if (((long)vFrameCis->nSize <= (long)uVar12) || (uVar12 == uVar3 + 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      p = (Vec_Int_t *)ppvVar6[uVar12];
      if (p->nSize != 0) {
        __assert_fail("Vec_IntSize(vFramePPsOne) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x14b,
                      "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                     );
      }
      pvVar7 = vFrameCis->pArray[uVar12];
      iVar14 = (int)uVar12;
      if (0 < *(int *)((long)pvVar7 + 4)) {
        local_48 = iVar14 + 1;
        lVar10 = 0;
        uVar13 = 0;
        do {
          pVVar5 = pAig->vObjs;
          if (pVVar5 == (Vec_Ptr_t *)0x0) {
            piVar8 = (int *)0x0;
          }
          else {
            uVar9 = *(uint *)(*(long *)((long)pvVar7 + 8) + lVar10 * 4);
            if (((int)uVar9 < 0) || (pVVar5->nSize <= (int)uVar9)) goto LAB_00505daa;
            piVar8 = (int *)pVVar5->pArray[uVar9];
          }
          if ((piVar8[6] & 7U) != 2) {
            __assert_fail("Aig_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                          ,0x14e,
                          "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                         );
          }
          iVar11 = *piVar8;
          iVar4 = pAig->nTruePis;
          if (iVar11 < iVar4) {
            iVar4 = ~uVar13 + iVar1 + pCex->nPis * local_48;
            if (iVar4 < 0) goto LAB_00505de8;
            uVar13 = uVar13 + 1;
            uVar9 = pCex->nPis * iVar14 + pCex->nRegs + iVar11;
            iVar11 = (uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) +
                     iVar4 * 2;
          }
          else if (uVar12 == 0) {
            if (iVar11 - iVar4 < 0) goto LAB_00505de8;
            iVar11 = (iVar11 - iVar4) * 2;
          }
          else {
            uVar9 = (iVar11 - iVar4) + pAig->nTruePos;
            if (((int)uVar9 < 0) || (pAig->vCos->nSize <= (int)uVar9)) goto LAB_00505daa;
            iVar11 = *(int *)((long)pAig->vCos->pArray[uVar9] + 0x28);
          }
          Vec_IntPush(p,iVar11);
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar7 + 4));
      }
      Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,vFramePPs,iVar14,vRoots);
      bVar2 = (long)uVar12 < (long)pCex->iFrame;
      uVar12 = uVar12 + 1;
    } while (bVar2);
    piVar8 = vRoots->pArray;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(vRoots);
  iVar1 = pCex->iPo;
  if ((-1 < (long)iVar1) && (iVar1 < pAig->vCos->nSize)) {
    uVar3 = *(uint *)((long)pAig->vCos->pArray[iVar1] + 0x28);
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10d,"int Abc_LitIsCompl(int)");
    }
    if ((uVar3 & 1) == 0) {
      __assert_fail("Abc_LitIsCompl(pObj->iData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                    ,0x15c,
                    "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                   );
    }
    return vFramePPs;
  }
LAB_00505daa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis )
{
    Vec_Vec_t * vFramePPs;
    Vec_Int_t * vRoots, * vFramePPsOne, * vFrameCisOne;
    Aig_Obj_t * pObj;
    int i, f, nPrioOffset;

    // initialize phase and priority
    Aig_ManForEachObj( pAig, pObj, i )
        pObj->iData = -1;

    // set the constant node to higher priority than the flops
    vFramePPs = Vec_VecStart( pCex->iFrame+1 );
    nPrioOffset = pCex->nRegs;
    Aig_ManConst1(pAig)->iData = Abc_Var2Lit( nPrioOffset + (pCex->iFrame + 1) * pCex->nPis, 1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        int nPiCount = 0;
        // fill in PP for the CIs
        vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
        vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
        assert( Vec_IntSize(vFramePPsOne) == 0 );
        Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
        {
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(pAig, pObj) )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( nPrioOffset + (f+1) * pCex->nPis - 1 - nPiCount++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj)) ) );
            else if ( f == 0 )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( Saig_ObjRegId(pAig, pObj), 0 ) );
            else
                Vec_IntPush( vFramePPsOne, Saig_ObjLoToLi(pAig, pObj)->iData );
        }
        // compute the PP info
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
    }
    Vec_IntFree( vRoots );
    // check the output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    assert( Abc_LitIsCompl(pObj->iData) );
    return vFramePPs;
}